

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMpiHandshake.cpp
# Opt level: O1

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* adios2::helper::HandshakeRank
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,string *filename,char mode,int timeoutSeconds,
            MPI_Comm localComm,int verbosity)

{
  pointer pcVar1;
  vector<int,std::allocator<int>> *pvVar2;
  iterator iVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  long lVar5;
  pointer pvVar6;
  int *piVar7;
  long lVar8;
  _Alloc_hider _Var9;
  char cVar10;
  int iVar11;
  pointer pvVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  istream *piVar16;
  int *piVar17;
  ulong uVar18;
  ostream *poVar19;
  undefined8 uVar20;
  long *plVar21;
  vector<int,_std::allocator<int>_> *i_2;
  pointer piVar22;
  pointer piVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  int *j;
  string line;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range3;
  int localRank;
  string local_6d8;
  int worldRank;
  string local_6b0;
  int local_690;
  int localSize;
  vector<int,_std::allocator<int>_> allLocalRanks;
  int worldSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  ifstream fs_1;
  undefined4 uStack_634;
  long local_628;
  long lStack_620;
  ios_base local_5b8 [392];
  int dims [3];
  undefined1 local_420 [232];
  ios_base local_338 [264];
  ofstream fs;
  long local_228;
  char local_220 [232];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_690 = verbosity;
  pvVar12 = (pointer)operator_new(0x48);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = pvVar12;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pvVar12;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar12 + 3;
  (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pvVar12 + 3;
  MPI_Comm_rank(localComm,&localRank);
  MPI_Comm_size(localComm,&localSize);
  MPI_Comm_rank(&ompi_mpi_comm_world,&worldRank);
  MPI_Comm_size(&ompi_mpi_comm_world,&worldSize);
  std::vector<int,_std::allocator<int>_>::vector
            (&allLocalRanks,(long)localSize,(allocator_type *)&fs_1);
  MPI_Gather(&worldRank,1,&ompi_mpi_int,
             allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,1,&ompi_mpi_int,0,localComm);
  if (localRank != 0) goto LAB_00130af2;
  std::ofstream::ofstream(&fs);
  pcVar1 = (filename->_M_dataplus)._M_p;
  dims._0_8_ = local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)dims,pcVar1,pcVar1 + filename->_M_string_length);
  std::__cxx11::string::append((char *)dims);
  plVar13 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)dims,stack0xfffffffffffffbd8,0,'\x01');
  plVar21 = plVar13 + 2;
  if ((long *)*plVar13 == plVar21) {
    local_628 = *plVar21;
    lStack_620 = plVar13[3];
    _fs_1 = &local_628;
  }
  else {
    local_628 = *plVar21;
    _fs_1 = (long *)*plVar13;
  }
  *plVar13 = (long)plVar21;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::open((string *)&fs,(_Ios_Openmode)&fs_1);
  if (_fs_1 != &local_628) {
    operator_delete(_fs_1);
  }
  if ((undefined1 *)dims._0_8_ != local_420) {
    operator_delete((void *)dims._0_8_);
  }
  piVar23 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar22 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      plVar13 = (long *)std::ostream::operator<<((ostream *)&fs,*piVar22);
      std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
      std::ostream::put((char)plVar13);
      std::ostream::flush();
      piVar22 = piVar22 + 1;
    } while (piVar22 != piVar23);
  }
  std::ofstream::close();
  if (mode == 'w') {
    if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar23 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        _fs_1 = (long *)CONCAT44(uStack_634,*piVar23);
        pvVar2 = (vector<int,std::allocator<int>> *)
                 (__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar3._M_current = *(int **)(pvVar2 + 8);
        if (iVar3._M_current == *(int **)(pvVar2 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar2,iVar3,(int *)&fs_1);
        }
        else {
          *iVar3._M_current = *piVar23;
          *(int **)(pvVar2 + 8) = iVar3._M_current + 1;
        }
        pvVar12 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar3._M_current =
             *(pointer *)
              ((long)&pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
        if (iVar3._M_current ==
            *(pointer *)
             ((long)&pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)(pvVar12 + 1),iVar3,(int *)&fs_1);
        }
        else {
          *iVar3._M_current = _fs_1;
          *(int **)((long)&pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8) = iVar3._M_current + 1;
        }
        piVar23 = piVar23 + 1;
      } while (piVar23 !=
               allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::ofstream::ofstream(dims);
    pcVar1 = (filename->_M_dataplus)._M_p;
    _fs_1 = &local_628;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_1,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&fs_1);
    std::ofstream::open((string *)dims,(_Ios_Openmode)(string *)&fs_1);
    if (_fs_1 != &local_628) {
      operator_delete(_fs_1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dims,"completed",9);
    std::ofstream::close();
    paVar24 = &line.field_2;
    do {
      std::ifstream::ifstream((string *)&fs_1);
      pcVar1 = (filename->_M_dataplus)._M_p;
      line._M_dataplus._M_p = (pointer)paVar24;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&line);
      std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != paVar24) {
        operator_delete(line._M_dataplus._M_p);
      }
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      line._M_dataplus._M_p = (pointer)paVar24;
      cVar10 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&fs_1,(string *)&line,cVar10);
      iVar11 = std::__cxx11::string::compare((char *)&line);
      if (iVar11 == 0) {
        std::ifstream::close();
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        pcVar1 = (filename->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6d8,pcVar1,pcVar1 + filename->_M_string_length);
        std::__cxx11::string::append((char *)&local_6d8);
        remove(local_6d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != paVar24) {
        operator_delete(line._M_dataplus._M_p);
      }
      std::ifstream::~ifstream((string *)&fs_1);
    } while (iVar11 != 0);
    std::ifstream::ifstream(&fs_1);
    pcVar1 = (filename->_M_dataplus)._M_p;
    line._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&line);
    std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != paVar24) {
      operator_delete(line._M_dataplus._M_p);
    }
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)paVar24;
    while( true ) {
      paVar24 = &line.field_2;
      cVar10 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
      piVar16 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&fs_1,(string *)&line,cVar10);
      _Var9 = line._M_dataplus;
      if (((byte)piVar16[*(long *)(*(long *)piVar16 + -0x18) + 0x20] & 5) != 0) break;
      pvVar4 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar17 = __errno_location();
      iVar11 = *piVar17;
      *piVar17 = 0;
      lVar14 = strtol(_Var9._M_p,(char **)&local_6d8,10);
      if (local_6d8._M_dataplus._M_p == _Var9._M_p) goto LAB_00130df6;
      if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*piVar17 == 0x22)) goto LAB_00130e02;
      if (*piVar17 == 0) {
        *piVar17 = iVar11;
      }
      local_6b0._M_dataplus._M_p._0_4_ = (int)lVar14;
      iVar3._M_current =
           (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar3._M_current ==
          (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar4,iVar3,(int *)&local_6b0);
      }
      else {
        *iVar3._M_current = (int)lVar14;
        (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar3._M_current + 1;
      }
      _Var9._M_p = line._M_dataplus._M_p;
      pvVar12 = (__return_storage_ptr__->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar11 = *piVar17;
      *piVar17 = 0;
      lVar14 = strtol(line._M_dataplus._M_p,(char **)&local_6d8,10);
      if (local_6d8._M_dataplus._M_p == _Var9._M_p) goto LAB_00130dea;
      if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*piVar17 == 0x22)) goto LAB_00130e0e;
      if (*piVar17 == 0) {
        *piVar17 = iVar11;
      }
      local_6b0._M_dataplus._M_p._0_4_ = (int)lVar14;
      iVar3._M_current =
           *(pointer *)
            ((long)&pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 0x10)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar12 + 2,iVar3,(int *)&local_6b0);
      }
      else {
        *iVar3._M_current = (int)lVar14;
        *(int **)((long)&pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8) = iVar3._M_current + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != paVar24) {
      operator_delete(line._M_dataplus._M_p);
    }
    std::ifstream::close();
    pcVar1 = (filename->_M_dataplus)._M_p;
    line._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&line);
    remove(line._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != paVar24) {
      operator_delete(line._M_dataplus._M_p);
    }
LAB_00130a75:
    std::ifstream::~ifstream(&fs_1);
    dims._0_8_ = _VTT;
    *(undefined8 *)((long)dims + *(long *)(_VTT + -0x18)) = _RegisterEngine;
    std::filebuf::~filebuf((filebuf *)(dims + 2));
    std::ios_base::~ios_base(local_338);
  }
  else if (mode == 'r') {
    if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar23 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        _fs_1 = (long *)CONCAT44(uStack_634,*piVar23);
        pvVar2 = (vector<int,std::allocator<int>> *)
                 (__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar3._M_current = *(int **)(pvVar2 + 8);
        if (iVar3._M_current == *(int **)(pvVar2 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar2,iVar3,(int *)&fs_1);
        }
        else {
          *iVar3._M_current = *piVar23;
          *(int **)(pvVar2 + 8) = iVar3._M_current + 1;
        }
        pvVar12 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar3._M_current =
             *(pointer *)
              ((long)&pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
        if (iVar3._M_current ==
            *(pointer *)
             ((long)&pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)(pvVar12 + 2),iVar3,(int *)&fs_1);
        }
        else {
          *iVar3._M_current = _fs_1;
          *(int **)((long)&pvVar12[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8) = iVar3._M_current + 1;
        }
        piVar23 = piVar23 + 1;
      } while (piVar23 !=
               allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::ofstream::ofstream(dims);
    pcVar1 = (filename->_M_dataplus)._M_p;
    _fs_1 = &local_628;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_1,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&fs_1);
    std::ofstream::open((string *)dims,(_Ios_Openmode)(string *)&fs_1);
    if (_fs_1 != &local_628) {
      operator_delete(_fs_1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dims,"completed",9);
    std::ofstream::close();
    lVar14 = std::chrono::_V2::system_clock::now();
    paVar24 = &line.field_2;
    do {
      std::ifstream::ifstream((string *)&fs_1);
      lVar15 = std::chrono::_V2::system_clock::now();
      if ((long)timeoutSeconds < (lVar15 - lVar14) / 1000000000) {
        line._M_dataplus._M_p = (pointer)paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)&line,"Helper","");
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"adiosMpiHandshake","")
        ;
        local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"HandshakeRank","");
        std::operator+(&local_658,"Mpi handshake timeout for Stream ",filename);
        Throw<std::runtime_error>(&line,&local_6d8,&local_6b0,&local_658,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != &local_658.field_2) {
          operator_delete(local_658._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
          operator_delete(local_6b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != paVar24) {
          operator_delete(line._M_dataplus._M_p);
        }
      }
      pcVar1 = (filename->_M_dataplus)._M_p;
      line._M_dataplus._M_p = (pointer)paVar24;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&line);
      std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != paVar24) {
        operator_delete(line._M_dataplus._M_p);
      }
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      line._M_dataplus._M_p = (pointer)paVar24;
      cVar10 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&fs_1,(string *)&line,cVar10);
      iVar11 = std::__cxx11::string::compare((char *)&line);
      if (iVar11 == 0) {
        std::ifstream::close();
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        pcVar1 = (filename->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6d8,pcVar1,pcVar1 + filename->_M_string_length);
        std::__cxx11::string::append((char *)&local_6d8);
        remove(local_6d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != paVar24) {
        operator_delete(line._M_dataplus._M_p);
      }
      std::ifstream::~ifstream((string *)&fs_1);
    } while (iVar11 != 0);
    std::ifstream::ifstream(&fs_1);
    pcVar1 = (filename->_M_dataplus)._M_p;
    line._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&line);
    std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != paVar24) {
      operator_delete(line._M_dataplus._M_p);
    }
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)paVar24;
    while( true ) {
      paVar24 = &line.field_2;
      cVar10 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
      piVar16 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&fs_1,(string *)&line,cVar10);
      _Var9 = line._M_dataplus;
      if (((byte)piVar16[*(long *)(*(long *)piVar16 + -0x18) + 0x20] & 5) != 0) break;
      pvVar4 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar17 = __errno_location();
      iVar11 = *piVar17;
      *piVar17 = 0;
      lVar14 = strtol(_Var9._M_p,(char **)&local_6d8,10);
      if (local_6d8._M_dataplus._M_p == _Var9._M_p) {
        std::__throw_invalid_argument("stoi");
LAB_00130dc6:
        std::__throw_out_of_range("stoi");
LAB_00130dd2:
        std::__throw_invalid_argument("stoi");
LAB_00130dde:
        std::__throw_out_of_range("stoi");
LAB_00130dea:
        std::__throw_invalid_argument("stoi");
LAB_00130df6:
        std::__throw_invalid_argument("stoi");
LAB_00130e02:
        std::__throw_out_of_range("stoi");
LAB_00130e0e:
        uVar20 = std::__throw_out_of_range("stoi");
        std::ifstream::~ifstream(&fs_1);
        std::ofstream::~ofstream(dims);
        std::ofstream::~ofstream(&fs);
        if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(__return_storage_ptr__);
        _Unwind_Resume(uVar20);
      }
      if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*piVar17 == 0x22)) goto LAB_00130dc6;
      if (*piVar17 == 0) {
        *piVar17 = iVar11;
      }
      local_6b0._M_dataplus._M_p._0_4_ = (int)lVar14;
      iVar3._M_current =
           (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar3._M_current ==
          (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar4,iVar3,(int *)&local_6b0);
      }
      else {
        *iVar3._M_current = (int)lVar14;
        (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar3._M_current + 1;
      }
      _Var9._M_p = line._M_dataplus._M_p;
      pvVar12 = (__return_storage_ptr__->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar11 = *piVar17;
      *piVar17 = 0;
      lVar14 = strtol(line._M_dataplus._M_p,(char **)&local_6d8,10);
      if (local_6d8._M_dataplus._M_p == _Var9._M_p) goto LAB_00130dd2;
      if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*piVar17 == 0x22)) goto LAB_00130dde;
      if (*piVar17 == 0) {
        *piVar17 = iVar11;
      }
      local_6b0._M_dataplus._M_p._0_4_ = (int)lVar14;
      iVar3._M_current =
           *(pointer *)
            ((long)&pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 0x10)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar12 + 1,iVar3,(int *)&local_6b0);
      }
      else {
        *iVar3._M_current = (int)lVar14;
        *(int **)((long)&pvVar12[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8) = iVar3._M_current + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != paVar24) {
      operator_delete(line._M_dataplus._M_p);
    }
    std::ifstream::close();
    pcVar1 = (filename->_M_dataplus)._M_p;
    line._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&line);
    remove(line._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != paVar24) {
      operator_delete(line._M_dataplus._M_p);
    }
    goto LAB_00130a75;
  }
  _fs = _VTT;
  *(undefined8 *)(&fs + *(long *)(_VTT + -0x18)) = _RegisterEngine;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
LAB_00130af2:
  if (localRank == 0) {
    piVar17 = dims;
    lVar14 = 2;
    do {
      pvVar12 = (__return_storage_ptr__->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar15 = *(long *)((long)pvVar12 + lVar14 * 4 + -8);
      lVar5 = *(long *)((long)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data + lVar14 * 4);
      uVar18 = lVar5 - lVar15 >> 2;
      *piVar17 = (int)uVar18;
      if (lVar5 != lVar15) {
        lVar8 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar15,lVar5,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar15,lVar5);
      }
      piVar17 = piVar17 + 1;
      lVar14 = lVar14 + 6;
    } while (lVar14 != 0x14);
  }
  piVar17 = dims;
  MPI_Bcast(piVar17,3,&ompi_mpi_int,0,localComm);
  if (localRank != 0) {
    lVar14 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar14),(long)*piVar17);
      piVar17 = piVar17 + 1;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  lVar14 = 8;
  do {
    pvVar12 = (__return_storage_ptr__->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar15 = *(long *)((long)pvVar12 + lVar14 + -8);
    MPI_Bcast(lVar15,(ulong)(*(long *)((long)&(pvVar12->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data + lVar14) - lVar15) >> 2,
              &ompi_mpi_int,0,localComm);
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x50);
  if (4 < local_690) {
    std::__cxx11::stringstream::stringstream((stringstream *)&fs_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,"World Rank ",0xb);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&local_628,worldRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
    pvVar12 = (__return_storage_ptr__->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (__return_storage_ptr__->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar12 != pvVar6) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,"    ",4);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)&local_628,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
        piVar7 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar17 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; piVar17 != piVar7; piVar17 = piVar17 + 1) {
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)&local_628,*piVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
        }
        cVar10 = (char)(ostream *)&local_628;
        std::ios::widen((char)*(undefined8 *)(local_628 + -0x18) + cVar10);
        std::ostream::put(cVar10);
        std::ostream::flush();
        iVar11 = iVar11 + 1;
        pvVar12 = pvVar12 + 1;
      } while (pvVar12 != pvVar6);
    }
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_fs,local_228);
    if (_fs != local_220) {
      operator_delete(_fs);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&fs_1);
    std::ios_base::~ios_base(local_5b8);
  }
  if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::vector<int>> HandshakeRank(const std::string &filename, const char mode,
                                                  const int timeoutSeconds, MPI_Comm localComm,
                                                  int verbosity)
{
    std::vector<std::vector<int>> ret(3);

    int localRank;
    int localSize;
    int worldRank;
    int worldSize;

    MPI_Comm_rank(localComm, &localRank);
    MPI_Comm_size(localComm, &localSize);

    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    std::vector<int> allLocalRanks(localSize);

    MPI_Gather(&worldRank, 1, MPI_INT, allLocalRanks.data(), 1, MPI_INT, 0, localComm);

    if (localRank == 0)
    {
        std::ofstream fs;
        fs.open(filename + "." + mode);
        for (auto rank : allLocalRanks)
        {
            fs << rank << std::endl;
        }
        fs.close();

        if (mode == 'r')
        {

            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[2].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".r.c");
            fsc << "completed";
            fsc.close();

            auto startTime = std::chrono::system_clock::now();
            while (true)
            {
                std::ifstream fs;
                try
                {
                    auto nowTime = std::chrono::system_clock::now();
                    auto duration =
                        std::chrono::duration_cast<std::chrono::seconds>(nowTime - startTime);
                    if (duration.count() > timeoutSeconds)
                    {
                        helper::Throw<std::runtime_error>(
                            "Helper", "adiosMpiHandshake", "HandshakeRank",
                            "Mpi handshake timeout for Stream " + filename);
                    }

                    fs.open(filename + ".w.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".w.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".w");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[1].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".w\0").c_str());
        }
        else if (mode == 'w')
        {
            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[1].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".w.c");
            fsc << "completed";
            fsc.close();

            while (true)
            {
                std::ifstream fs;
                try
                {
                    fs.open(filename + ".r.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".r.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".r");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[2].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".r\0").c_str());
        }
    }

    int dims[3];

    if (localRank == 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            dims[i] = static_cast<int>(ret[i].size());
            std::sort(ret[i].begin(), ret[i].end());
        }
    }

    MPI_Bcast(dims, 3, MPI_INT, 0, localComm);

    if (localRank != 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            ret[i].resize(dims[i]);
        }
    }

    for (int i = 0; i < 3; ++i)
    {
        MPI_Bcast(ret[i].data(), static_cast<int>(ret[i].size()), MPI_INT, 0, localComm);
    }

    if (verbosity >= 5)
    {
        std::stringstream output;
        output << "World Rank " << worldRank << ": " << std::endl;
        int s = 0;
        for (const auto &i : ret)
        {
            output << "    " << s << ": ";
            for (const auto &j : i)
            {
                output << j << ", ";
            }
            output << std::endl;
            ++s;
        }
        std::cout << output.str();
    }

    return ret;
}